

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O0

void QScopedPointerDeleter<QOpenGLShaderProgram>::cleanup(EVP_PKEY_CTX *ctx)

{
  if (ctx != (EVP_PKEY_CTX *)0x0) {
    (**(code **)(*(long *)ctx + 0x20))();
  }
  return;
}

Assistant:

static inline void cleanup(T *pointer) noexcept
    {
        // Enforce a complete type.
        // If you get a compile error here, read the section on forward declared
        // classes in the QScopedPointer documentation.
        typedef char IsIncompleteType[ sizeof(T) ? 1 : -1 ];
        (void) sizeof(IsIncompleteType);

        delete pointer;
    }